

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O2

int ov_clear(OggVorbis_File *vf)

{
  _func_int_void_ptr *p_Var1;
  int iVar2;
  int i;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if (vf != (OggVorbis_File *)0x0) {
    vorbis_block_clear(&vf->vb);
    vorbis_dsp_clear(&vf->vd);
    ogg_stream_clear(&vf->os);
    if ((vf->vi != (vorbis_info *)0x0) && (iVar2 = vf->links, iVar2 != 0)) {
      lVar4 = 0;
      lVar5 = 0;
      for (lVar3 = 0; lVar3 < iVar2; lVar3 = lVar3 + 1) {
        vorbis_info_clear((vorbis_info *)((long)&vf->vi->version + lVar4));
        vorbis_comment_clear((vorbis_comment *)((long)&vf->vc->user_comments + lVar5));
        iVar2 = vf->links;
        lVar5 = lVar5 + 0x20;
        lVar4 = lVar4 + 0x38;
      }
      free(vf->vi);
      free(vf->vc);
    }
    free(vf->dataoffsets);
    free(vf->pcmlengths);
    free(vf->serialnos);
    free(vf->offsets);
    ogg_sync_clear(&vf->oy);
    if ((vf->datasource != (void *)0x0) &&
       (p_Var1 = (vf->callbacks).close_func, p_Var1 != (_func_int_void_ptr *)0x0)) {
      (*p_Var1)(vf->datasource);
    }
    memset(vf,0,0x3b0);
  }
  return 0;
}

Assistant:

int ov_clear(OggVorbis_File *vf){
  if(vf){
    vorbis_block_clear(&vf->vb);
    vorbis_dsp_clear(&vf->vd);
    ogg_stream_clear(&vf->os);

    if(vf->vi && vf->links){
      int i;
      for(i=0;i<vf->links;i++){
        vorbis_info_clear(vf->vi+i);
        vorbis_comment_clear(vf->vc+i);
      }
      _ogg_free(vf->vi);
      _ogg_free(vf->vc);
    }
    if(vf->dataoffsets)_ogg_free(vf->dataoffsets);
    if(vf->pcmlengths)_ogg_free(vf->pcmlengths);
    if(vf->serialnos)_ogg_free(vf->serialnos);
    if(vf->offsets)_ogg_free(vf->offsets);
    ogg_sync_clear(&vf->oy);
    if(vf->datasource && vf->callbacks.close_func)
      (vf->callbacks.close_func)(vf->datasource);
    memset(vf,0,sizeof(*vf));
  }
#ifdef DEBUG_LEAKS
  _VDBG_dump();
#endif
  return(0);
}